

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void google::protobuf::anon_unknown_6::ReportReflectionUsageError
               (Descriptor *descriptor,FieldDescriptor *field,char *method,char *description)

{
  char *pcVar1;
  LogMessage *pLVar2;
  string_view v;
  string_view v_00;
  char *local_38;
  char *local_30;
  LogMessage local_28;
  
  local_38 = description;
  local_30 = method;
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0xce);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&local_28,
                      (char (*) [87])
                      "Protocol Buffer reflection usage error:\n  Method      : google::protobuf::Reflection::"
                     );
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<<const_char_*,_0>
                     (pLVar2,&local_30);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [18])"\n  Message type: ");
  pcVar1 = (descriptor->all_names_).payload_;
  v._M_len = (ulong)*(ushort *)(pcVar1 + 2);
  v._M_str = pcVar1 + ~v._M_len;
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,v);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [18])"\n  Field       : ");
  pcVar1 = (field->all_names_).payload_;
  v_00._M_len = (ulong)*(ushort *)(pcVar1 + 2);
  v_00._M_str = pcVar1 + ~v_00._M_len;
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,v_00);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [18])"\n  Problem     : ");
  absl::lts_20250127::log_internal::LogMessage::operator<<<const_char_*,_0>(pLVar2,&local_38);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

void ReportReflectionUsageError(const Descriptor* descriptor,
                                const FieldDescriptor* field,
                                const char* method, const char* description) {
  ABSL_LOG(FATAL) << "Protocol Buffer reflection usage error:\n"
                     "  Method      : google::protobuf::Reflection::"
                  << method
                  << "\n"
                     "  Message type: "
                  << descriptor->full_name()
                  << "\n"
                     "  Field       : "
                  << field->full_name()
                  << "\n"
                     "  Problem     : "
                  << description;
}